

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenFullyQualifiedNameGetter
          (CppGenerator *this,StructDef *struct_def,string *name)

{
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string fullname;
  string *name_local;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  if (((this->opts_).super_IDLOptions.generate_name_strings & 1U) != 0) {
    fullname.field_2._8_8_ = name;
    Namespace::GetFullyQualifiedName
              ((string *)local_40,(struct_def->super_Definition).defined_namespace,name,1000);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"NAME",&local_61);
    CodeWriter::SetValue(&this->code_,&local_60,(string *)local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"CONSTEXPR",&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"FLATBUFFERS_CONSTEXPR_CPP11",&local_c1);
    CodeWriter::SetValue(&this->code_,&local_98,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"  static {{CONSTEXPR}} const char *GetFullyQualifiedName() {",
               &local_e9);
    CodeWriter::operator+=(&this->code_,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"    return \"{{NAME}}\";",&local_111);
    CodeWriter::operator+=(&this->code_,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"  }",&local_139);
    CodeWriter::operator+=(&this->code_,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void GenFullyQualifiedNameGetter(const StructDef &struct_def,
                                   const std::string &name) {
    if (!opts_.generate_name_strings) { return; }
    auto fullname = struct_def.defined_namespace->GetFullyQualifiedName(name);
    code_.SetValue("NAME", fullname);
    code_.SetValue("CONSTEXPR", "FLATBUFFERS_CONSTEXPR_CPP11");
    code_ += "  static {{CONSTEXPR}} const char *GetFullyQualifiedName() {";
    code_ += "    return \"{{NAME}}\";";
    code_ += "  }";
  }